

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

void __thiscall rengine::WorkQueue::~WorkQueue(WorkQueue *this)

{
  WorkQueue *this_local;
  
  std::mutex::lock(&this->m_mutex);
  this->m_running = false;
  std::condition_variable::notify_one();
  std::mutex::unlock(&this->m_mutex);
  std::thread::join();
  std::__cxx11::
  list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ::~list(&this->m_jobs);
  std::condition_variable::~condition_variable(&this->m_condition);
  std::thread::~thread(&this->m_thread);
  return;
}

Assistant:

inline WorkQueue::~WorkQueue()
{
    // Tell thread to exit..
    m_mutex.lock();
    m_running = false;
    m_condition.notify_one();
    m_mutex.unlock();

    // Wait for it to finish..
    m_thread.join();
}